

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void WindowSettingsHandler_ReadLine
               (ImGuiContext *param_1,ImGuiSettingsHandler *param_2,void *entry,char *line)

{
  int iVar1;
  ImVec2ih local_4c;
  ImVec2ih local_48;
  ImVec2ih local_44;
  undefined4 local_40;
  int local_3c;
  ImU32 u1;
  int i;
  int y;
  int x;
  ImGuiWindowSettings *settings;
  char *line_local;
  void *entry_local;
  ImGuiSettingsHandler *param_1_local;
  ImGuiContext *param_0_local;
  
  _y = entry;
  settings = (ImGuiWindowSettings *)line;
  line_local = (char *)entry;
  entry_local = param_2;
  param_1_local = (ImGuiSettingsHandler *)param_1;
  iVar1 = __isoc99_sscanf(line,"Pos=%i,%i",&i,&u1);
  if (iVar1 == 2) {
    ImVec2ih::ImVec2ih(&local_44,(short)i,(short)u1);
    *(ImVec2ih *)((long)_y + 4) = local_44;
  }
  else {
    iVar1 = __isoc99_sscanf(settings,"Size=%i,%i",&i,&u1);
    if (iVar1 == 2) {
      ImVec2ih::ImVec2ih(&local_48,(short)i,(short)u1);
      *(ImVec2ih *)((long)_y + 8) = local_48;
    }
    else {
      iVar1 = __isoc99_sscanf(settings,"ViewportId=0x%08X",&local_40);
      if (iVar1 == 1) {
        *(undefined4 *)((long)_y + 0x10) = local_40;
      }
      else {
        iVar1 = __isoc99_sscanf(settings,"ViewportPos=%i,%i",&i,&u1);
        if (iVar1 == 2) {
          ImVec2ih::ImVec2ih(&local_4c,(short)i,(short)u1);
          *(ImVec2ih *)((long)_y + 0xc) = local_4c;
        }
        else {
          iVar1 = __isoc99_sscanf(settings,"Collapsed=%d",&local_3c);
          if (iVar1 == 1) {
            *(bool *)((long)_y + 0x1e) = local_3c != 0;
          }
          else {
            iVar1 = __isoc99_sscanf(settings,"DockId=0x%X,%d",&local_40,&local_3c);
            if (iVar1 == 2) {
              *(undefined4 *)((long)_y + 0x14) = local_40;
              *(short *)((long)_y + 0x1c) = (short)local_3c;
            }
            else {
              iVar1 = __isoc99_sscanf(settings,"DockId=0x%X",&local_40);
              if (iVar1 == 1) {
                *(undefined4 *)((long)_y + 0x14) = local_40;
                *(undefined2 *)((long)_y + 0x1c) = 0xffff;
              }
              else {
                iVar1 = __isoc99_sscanf(settings,"ClassId=0x%X",&local_40);
                if (iVar1 == 1) {
                  *(undefined4 *)((long)_y + 0x18) = local_40;
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void WindowSettingsHandler_ReadLine(ImGuiContext*, ImGuiSettingsHandler*, void* entry, const char* line)
{
    ImGuiWindowSettings* settings = (ImGuiWindowSettings*)entry;
    int x, y;
    int i;
    ImU32 u1;
    if (sscanf(line, "Pos=%i,%i", &x, &y) == 2)             { settings->Pos = ImVec2ih((short)x, (short)y); }
    else if (sscanf(line, "Size=%i,%i", &x, &y) == 2)       { settings->Size = ImVec2ih((short)x, (short)y); }
    else if (sscanf(line, "ViewportId=0x%08X", &u1) == 1)   { settings->ViewportId = u1; }
    else if (sscanf(line, "ViewportPos=%i,%i", &x, &y) == 2){ settings->ViewportPos = ImVec2ih((short)x, (short)y); }
    else if (sscanf(line, "Collapsed=%d", &i) == 1)         { settings->Collapsed = (i != 0); }
    else if (sscanf(line, "DockId=0x%X,%d", &u1, &i) == 2)  { settings->DockId = u1; settings->DockOrder = (short)i; }
    else if (sscanf(line, "DockId=0x%X", &u1) == 1)         { settings->DockId = u1; settings->DockOrder = -1; }
    else if (sscanf(line, "ClassId=0x%X", &u1) == 1)        { settings->ClassId = u1; }
}